

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
args::ValueFlagBase::GetDescription
          (ValueFlagBase *this,string *shortPrefix,string *longPrefix,string *shortSeparator,
          string *longSeparator)

{
  bool bVar1;
  reference pbVar2;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>_>_> *this_00;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>_>_> *this_01;
  long *in_RSI;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  string *in_R9;
  const_iterator it;
  ostringstream flagstream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagStrings;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *description;
  string *psVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffd60;
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  ostringstream local_218 [336];
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  Matcher *in_stack_ffffffffffffff58;
  string local_a0 [16];
  string *in_stack_ffffffffffffff70;
  string local_70 [63];
  byte local_31;
  string *local_30;
  
  local_31 = 0;
  local_30 = in_R9;
  std::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::tuple<true,_true>((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x12827e);
  (**(code **)(*in_RSI + 0x28))(local_70);
  std::__cxx11::string::string(local_a0,local_30);
  psVar3 = local_a0;
  Matcher::GetFlagStrings
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_220._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                 ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)psVar3);
  while( true ) {
    local_228 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)psVar3);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd60,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)psVar3);
    if (!bVar1) break;
    local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)psVar3);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffffd60,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)psVar3);
    if (bVar1) {
      std::operator<<((ostream *)local_218,", ");
    }
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_220);
    std::operator<<((ostream *)local_218,(string *)pbVar2);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_220);
  }
  std::__cxx11::ostringstream::str();
  this_00 = std::get<0ul,std::__cxx11::string,std::__cxx11::string>
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x1284c4);
  std::__cxx11::string::operator=((string *)this_00,local_250);
  std::__cxx11::string::~string(local_250);
  psVar3 = (string *)(in_RSI + 2);
  this_01 = std::get<1ul,std::__cxx11::string,std::__cxx11::string>
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x1284f8);
  std::__cxx11::string::operator=((string *)this_01,psVar3);
  local_31 = 1;
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)psVar3);
  if ((local_31 & 1) == 0) {
    std::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x12854e);
  }
  return in_RDI;
}

Assistant:

virtual std::tuple<std::string, std::string> GetDescription(const std::string &shortPrefix, const std::string &longPrefix, const std::string &shortSeparator, const std::string &longSeparator) const override
            {
                std::tuple<std::string, std::string> description;
                const auto flagStrings = matcher.GetFlagStrings(shortPrefix, longPrefix, Name(), shortSeparator, longSeparator);
                std::ostringstream flagstream;
                for (auto it = std::begin(flagStrings); it != std::end(flagStrings); ++it)
                {
                    if (it != std::begin(flagStrings))
                    {
                        flagstream << ", ";
                    }
                    flagstream << *it;
                }
                std::get<0>(description) = flagstream.str();
                std::get<1>(description) = help;
                return description;
            }